

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<int,_2UL>_> *value)

{
  bool bVar1;
  int2 v;
  array<int,_2UL> local_20;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ParseBasicTypeTuple<int,2ul>(this,&local_20);
    if (bVar1) {
      nonstd::optional_lite::optional<std::array<int,2ul>>::operator=
                ((optional<std::array<int,2ul>> *)value,&local_20);
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::int2> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::int2 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}